

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall deqp::gls::ContextArrayPack::~ContextArrayPack(ContextArrayPack *this)

{
  ~ContextArrayPack(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

ContextArrayPack::~ContextArrayPack (void)
{
	for (std::vector<ContextArray*>::iterator itr = m_arrays.begin(); itr != m_arrays.end(); itr++)
		delete *itr;

	delete m_program;
}